

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFObjectParser.cpp
# Opt level: O2

PDFObject * __thiscall PDFObjectParser::ParseNumber(PDFObjectParser *this,string *inToken)

{
  double in_RAX;
  long lVar1;
  PDFReal *this_00;
  Trace *this_01;
  BoxingBase<double> local_18;
  
  local_18.boxedValue = in_RAX;
  lVar1 = std::__cxx11::string::find((char)inToken,0x2e);
  if (lVar1 == -1) {
    BoxingBaseWithRW<long_long,_STDStreamsReader<long_long>,_STDStreamsWriter<long_long>_>::
    BoxingBaseWithRW((BoxingBaseWithRW<long_long,_STDStreamsReader<long_long>,_STDStreamsWriter<long_long>_>
                      *)&local_18,inToken);
    if ((double)(long)SUB84(local_18.boxedValue,0) == local_18.boxedValue) {
      this_00 = (PDFReal *)operator_new(0x50);
      PDFInteger::PDFInteger((PDFInteger *)this_00,(longlong)local_18.boxedValue);
    }
    else {
      this_01 = Trace::DefaultTrace();
      this_00 = (PDFReal *)0x0;
      Trace::TraceToLog(this_01,
                        "PDFObjectParser::ParseNumber, parsed integer %lld is outside of the allowed range for PDF integers - %ld to %ld"
                        ,local_18.boxedValue,0xffffffff80000000,0x7fffffff);
    }
  }
  else {
    this_00 = (PDFReal *)operator_new(0x50);
    BoxingBaseWithRW<double,_STDStreamsReader<double>,_STDStreamsWriter<double>_>::BoxingBaseWithRW
              ((BoxingBaseWithRW<double,_STDStreamsReader<double>,_STDStreamsWriter<double>_> *)
               &local_18,inToken);
    PDFReal::PDFReal(this_00,local_18.boxedValue);
  }
  return &this_00->super_PDFObject;
}

Assistant:

PDFObject* PDFObjectParser::ParseNumber(const std::string& inToken)
{
	// once we know this is a number, then parsing is easy. just determine if it's a real or integer, so as to separate classes for better accuracy
	if(inToken.find(scDot) != inToken.npos) {
		return new PDFReal(Double(inToken));
	} else {
		long long integerValue = LongLong(inToken);

		// validate int value according to PDF limits. ignore if outside of range
		if((integerValue > MAX_PDF_INT) || (integerValue < MIN_PDF_INT)) {
			TRACE_LOG3("PDFObjectParser::ParseNumber, parsed integer %lld is outside of the allowed range for PDF integers - %ld to %ld", integerValue, MIN_PDF_INT, MAX_PDF_INT);
			return NULL;
		}

		return new PDFInteger(integerValue);
	}
}